

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader capnp::DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(Reader *reader)

{
  ArrayPtr<const_unsigned_char> AVar1;
  Fault local_38;
  Fault f;
  Reader *reader_local;
  size_t sStack_10;
  
  if (reader->type == TEXT) {
    _f = kj::StringPtr::asBytes(&(reader->field_1).textValue.super_StringPtr);
    Data::Reader::Reader((Reader *)&reader_local,(ArrayPtr<const_unsigned_char> *)&f);
  }
  else if (reader->type == DATA) {
    reader_local = (Reader *)(reader->field_1).anyPointerValue.reader.segment;
    sStack_10 = (reader->field_1).textValue.super_StringPtr.content.size_;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x736,FAILED,"reader.type == DATA","\"Value type mismatch.\"",
               (char (*) [21])"Value type mismatch.");
    reader_local = (Reader *)0x0;
    sStack_10 = 0;
    Data::Reader::Reader((Reader *)&reader_local);
    kj::_::Debug::Fault::~Fault(&local_38);
  }
  AVar1.size_ = sStack_10;
  AVar1.ptr = (uchar *)reader_local;
  return (Reader)AVar1;
}

Assistant:

Data::Reader DynamicValue::Reader::AsImpl<Data>::apply(const Reader& reader) {
  if (reader.type == TEXT) {
    // Coerce text to data.
    return reader.textValue.asBytes();
  }
  KJ_REQUIRE(reader.type == DATA, "Value type mismatch.") {
    return Data::Reader();
  }
  return reader.dataValue;
}